

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_type.c
# Opt level: O2

value type_metadata(type_conflict t)

{
  value v;
  value *ppvVar1;
  value pvVar2;
  value *ppvVar3;
  value pvVar4;
  size_t length;
  value pvVar5;
  int i;
  char *__s;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string("type",4);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      if (t == (type_conflict)0x0) {
        __s = "";
      }
      else {
        __s = t->name;
      }
      pvVar2 = value_create_array((value *)0x0,2);
      if (pvVar2 != (value)0x0) {
        ppvVar3 = value_to_array(pvVar2);
        pvVar4 = value_create_string("name",4);
        *ppvVar3 = pvVar4;
        if (pvVar4 != (value)0x0) {
          length = strlen(__s);
          pvVar4 = value_create_string(__s,length);
          ppvVar3[1] = pvVar4;
          if ((pvVar4 != (value)0x0) &&
             (pvVar4 = value_create_array((value *)0x0,2), pvVar4 != (value)0x0)) {
            ppvVar3 = value_to_array(pvVar4);
            pvVar5 = value_create_string("id",2);
            *ppvVar3 = pvVar5;
            if (pvVar5 != (value)0x0) {
              if (t == (type_conflict)0x0) {
                i = 0x14;
              }
              else {
                i = t->id;
              }
              pvVar5 = value_create_int(i);
              ppvVar3[1] = pvVar5;
              if ((pvVar5 != (value)0x0) &&
                 (pvVar5 = value_create_map((value *)0x0,2), pvVar5 != (value)0x0)) {
                ppvVar3 = value_to_map(pvVar5);
                *ppvVar3 = pvVar2;
                ppvVar3[1] = pvVar4;
                ppvVar1[1] = pvVar5;
                return v;
              }
            }
            value_type_destroy(pvVar2);
            pvVar2 = pvVar4;
          }
        }
        value_type_destroy(pvVar2);
      }
      ppvVar1[1] = (value)0x0;
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value type_metadata(type t)
{
	/* The structure of the type is an array (tuple), but it can be used as a pair (key, data) of a map:
	* ["type", {"name":"","id":18}]
	* {"type":{"name":"","id":18}}
	*/

	static const char type_str[] = "type";

	value *v_array, v = value_create_array(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);

	v_array[0] = value_create_string(type_str, sizeof(type_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_array[1] = type_metadata_impl(t);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}